

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_var.h
# Opt level: O0

void var_act_bump(solver_t *s,uint var)

{
  int iVar1;
  sdbl_t *psVar2;
  sdbl_t sVar3;
  act_t *activity;
  uint var_local;
  solver_t *s_local;
  
  psVar2 = vec_sdbl_data(s->activity);
  sVar3 = sdbl_add(psVar2[var],s->var_act_inc);
  psVar2[var] = sVar3;
  if ((s->opts).var_act_limit < psVar2[var]) {
    var_act_rescale(s);
  }
  iVar1 = heap_in_heap(s->var_order,var);
  if (iVar1 != 0) {
    heap_decrease(s->var_order,var);
  }
  return;
}

Assistant:

static inline void var_act_bump(solver_t *s, unsigned var)
{
    act_t *activity = vec_act_data(s->activity);

    activity[var] = sdbl_add(activity[var], s->var_act_inc);
    if (activity[var] > s->opts.var_act_limit)
        var_act_rescale(s);
    if (heap_in_heap(s->var_order, var))
        heap_decrease(s->var_order, var);
}